

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_SelectWeapon
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  AWeapon *this;
  PClassActor *type;
  int val;
  char *pcVar4;
  AActor *this_00;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003e300b;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e2ff2:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e300b:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc14,
                  "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this_00 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this_00 == (AActor *)0x0) goto LAB_003e2e45;
    bVar2 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e300b;
    }
  }
  else {
    if (this_00 != (AActor *)0x0) goto LAB_003e2ff2;
LAB_003e2e45:
    this_00 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003e3071;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_003e2ffb:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e3071:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc15,
                  "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  type = (PClassActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_003e2e94;
    bVar2 = PClass::IsAncestorOf(AWeapon::RegistrationInfo.MyClass,(PClass *)type);
    if (!bVar2) {
      pcVar4 = "cls == NULL || cls->IsDescendantOf(RUNTIME_CLASS(AWeapon))";
      goto LAB_003e3071;
    }
    bVar3 = 0;
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_003e2ffb;
LAB_003e2e94:
    bVar3 = 1;
    type = (PClassActor *)0x0;
  }
  if ((uint)numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003e3033;
    }
  }
  else if (param[2].field_0.field_3.Type != '\0') {
    pcVar4 = "(param[paramnum]).Type == REGT_INT";
LAB_003e3033:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc16,
                  "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  uVar1 = param[2].field_0.i;
  val = 1;
  if (((bool)(bVar3 & (uVar1 & 1) == 0)) || (this_00->player == (player_t *)0x0)) {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xc1c,
                    "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    this = (AWeapon *)AActor::FindInventory(this_00,type,false);
    if ((this != (AWeapon *)0x0) &&
       (bVar2 = DObject::IsKindOf((DObject *)this,AWeapon::RegistrationInfo.MyClass), bVar2)) {
      if (this_00->player->ReadyWeapon != this) {
        this_00->player->PendingWeapon = this;
      }
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0xc27,
                      "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      goto LAB_003e2f61;
    }
    if ((uVar1 & 1) != 0) {
      APlayerPawn::PickNewWeapon(this_00->player->mo,(PClassAmmo *)0x0);
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0xc2f,
                      "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      goto LAB_003e2f61;
    }
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xc33,
                    "int AF_AActor_A_SelectWeapon(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  val = 0;
LAB_003e2f61:
  VMReturn::SetInt(ret,val);
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SelectWeapon)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(cls, AWeapon);
	PARAM_INT_DEF(flags);

	bool selectPriority = !!(flags & SWF_SELECTPRIORITY);

	if ((!selectPriority && cls == NULL) || self->player == NULL)
	{
		ACTION_RETURN_BOOL(false);
	}

	AWeapon *weaponitem = static_cast<AWeapon*>(self->FindInventory(cls));

	if (weaponitem != NULL && weaponitem->IsKindOf(RUNTIME_CLASS(AWeapon)))
	{
		if (self->player->ReadyWeapon != weaponitem)
		{
			self->player->PendingWeapon = weaponitem;
		}
		ACTION_RETURN_BOOL(true);
	}
	else if (selectPriority)
	{
		// [XA] if the named weapon cannot be found (or is a dummy like 'None'),
		//      select the next highest priority weapon. This is basically
		//      the same as A_CheckReload minus the ammo check. Handy.
		self->player->mo->PickNewWeapon(NULL);
		ACTION_RETURN_BOOL(true);
	}
	else
	{
		ACTION_RETURN_BOOL(false);
	}
}